

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ConcurrentQueue
          (ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          size_t capacity)

{
  undefined1 *puVar1;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *in_RSI;
  size_t in_RDI;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffa8;
  __integral_type_conflict in_stack_ffffffffffffffac;
  atomic<unsigned_long> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  
  uVar2 = 0;
  this_00 = (atomic<unsigned_long> *)0x0;
  std::
  atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
  ::atomic((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
            *)0x0,(__pointer_type)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)this_00,in_stack_ffffffffffffffac);
  std::atomic<unsigned_long>::atomic
            (this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  ::FreeList((FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
              *)0x11b50d);
  std::
  array<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP,_32UL>
  ::array((array<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP,_32UL>
           *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
  puVar1 = (undefined1 *)(in_RDI + 600);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)this_00,in_stack_ffffffffffffffac);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)this_00,in_stack_ffffffffffffffac);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *puVar1 = 0;
  populate_initial_implicit_producer_hash(in_RSI);
  populate_initial_block_list
            ((ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_RDI);
  return;
}

Assistant:

explicit ConcurrentQueue(size_t capacity = 6 * BLOCK_SIZE)
        : producerListTail(nullptr),
        producerCount(0),
        initialBlockPoolIndex(0),
        nextExplicitConsumerId(0),
        globalExplicitConsumerOffset(0)
    {
        implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
        populate_initial_implicit_producer_hash();
        populate_initial_block_list(capacity / BLOCK_SIZE + ((capacity & (BLOCK_SIZE - 1)) == 0 ? 0 : 1));
        
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
        // Track all the producers using a fully-resolved typed list for
        // each kind; this makes it possible to debug them starting from
        // the root queue object (otherwise wacky casts are needed that
        // don't compile in the debugger's expression evaluator).
        explicitProducers.store(nullptr, std::memory_order_relaxed);
        implicitProducers.store(nullptr, std::memory_order_relaxed);
#endif
    }